

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O3

bool __thiscall
despot::Bridge::Step
          (Bridge *this,State *s,double random_num,ACT_TYPE action,double *reward,OBS_TYPE *obs)

{
  int iVar1;
  
  *obs = 1;
  if (LEFT == action) {
    *reward = -1.0;
    if (*(int *)(s + 0x20) < 1) {
      return false;
    }
    iVar1 = *(int *)(s + 0x20) + -1;
  }
  else {
    iVar1 = *(int *)(s + 0x20);
    if (RIGHT != action) {
      *reward = (double)(-0x14 - iVar1);
      return true;
    }
    if (BRIDGELENGTH + -1 <= iVar1) {
      *reward = 0.0;
      return true;
    }
    *reward = -1.0;
    iVar1 = iVar1 + 1;
  }
  *(int *)(s + 0x20) = iVar1;
  return false;
}

Assistant:

bool Bridge::Step(State& s, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	BridgeState& state = static_cast<BridgeState&>(s);
	bool terminal = false;
	int& position = state.position;

	obs = 1;
	if (action == LEFT) {
		reward = -1;
		if (position > 0)
			position--;
	} else if (action == RIGHT) {
		if (position < BRIDGELENGTH - 1) {
			reward = -1;
			position++;
		} else {
			reward = 0;
			terminal = true;
		}
	} else { // HELP
		reward = -20 - position;
		terminal = true;
	}
	return terminal;
}